

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioport.c
# Opt level: O2

uint16_t cpu_inw_x86_64(uc_struct_conflict *uc,uint32_t addr)

{
  void *pvVar1;
  uint16_t uVar2;
  list_item *plVar3;
  
  plVar3 = (list_item *)(uc->hook + 1);
  do {
    plVar3 = plVar3->next;
    if ((plVar3 == (list_item *)0x0) || (pvVar1 = plVar3->data, pvVar1 == (void *)0x0)) {
      return 0;
    }
  } while ((*(char *)((long)pvVar1 + 0x14) != '\0') || (*(int *)((long)pvVar1 + 4) != 0xda));
  uVar2 = (**(code **)((long)pvVar1 + 0x28))(uc,addr,2,*(undefined8 *)((long)pvVar1 + 0x30));
  return uVar2;
}

Assistant:

uint16_t cpu_inw(struct uc_struct *uc, uint32_t addr)
{
    // uint8_t buf[2];
    // uint16_t val;

    // address_space_read(&uc->address_space_io, addr, MEMTXATTRS_UNSPECIFIED, buf, 2);
    // val = lduw_p(buf);

    //LOG_IOPORT("inw : %04"FMT_pioaddr" %04"PRIx16"\n", addr, val);
    // Unicorn: call registered IN callbacks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (hook->insn == UC_X86_INS_IN)
            return ((uc_cb_insn_in_t)hook->callback)(uc, addr, 2, hook->user_data);
    }

    return 0;
}